

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

int __thiscall
soplex::SPxDevexPR<double>::selectLeaveX(SPxDevexPR<double> *this,double feastol,int start,int incr)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar4;
  int end;
  int bstI;
  double best;
  double *cpen;
  double *fTest;
  double x;
  int local_3c;
  double local_38;
  int local_14;
  
  SPxSolverBase<double>::fTest(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar2 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2a8ee1);
  pdVar3 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2a8efd);
  local_38 = 0.0;
  local_3c = -1;
  iVar1 = VectorBase<double>::dim((VectorBase<double> *)0x2a8f2a);
  for (local_14 = in_ESI; local_14 < iVar1; local_14 = in_EDX + local_14) {
    if ((pdVar2[local_14] < -in_XMM0_Qa) &&
       (dVar4 = devexpr::computePrice<double>(pdVar2[local_14],pdVar3[local_14],in_XMM0_Qa),
       local_38 < dVar4)) {
      local_3c = local_14;
      *(double *)(in_RDI + 0x38) = pdVar3[local_14];
      local_38 = dVar4;
    }
  }
  return local_3c;
}

Assistant:

int SPxDevexPR<R>::selectLeaveX(R feastol, int start, int incr)
{
   R x;

   const R* fTest = this->thesolver->fTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   R best = 0;
   int bstI = -1;
   int end = this->thesolver->coWeights.dim();

   for(; start < end; start += incr)
   {
      if(fTest[start] < -feastol)
      {
         x = devexpr::computePrice(fTest[start], cpen[start], feastol);

         if(x > best)
         {
            best = x;
            bstI = start;
            last = cpen[start];
         }
      }
   }

   return bstI;
}